

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_andnot.c
# Opt level: O1

_Bool bitset_run_container_iandnot
                (bitset_container_t *src_1,run_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  ushort uVar2;
  rle16_t *prVar3;
  uint64_t *puVar4;
  int iVar5;
  ulong uVar6;
  array_container_t *paVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  byte bVar11;
  uint uVar12;
  
  *dst = src_1;
  iVar5 = src_2->n_runs;
  if (0 < (long)iVar5) {
    prVar3 = src_2->runs;
    puVar4 = src_1->words;
    lVar10 = 0;
    do {
      uVar1 = prVar3[lVar10].value;
      uVar2 = prVar3[lVar10].length;
      if ((uint)uVar2 + (uint)uVar1 + 1 != (uint)uVar1) {
        uVar12 = (uint)uVar2 + (uint)uVar1;
        uVar8 = (uint)(uVar1 >> 6);
        uVar6 = -1L << ((byte)uVar1 & 0x3f);
        uVar9 = uVar12 >> 6;
        bVar11 = (byte)uVar12;
        if (uVar9 - uVar8 == 0) {
          bVar11 = ~bVar11;
          uVar6 = (uVar6 << (bVar11 & 0x3f)) >> (bVar11 & 0x3f);
          uVar9 = uVar8;
        }
        else {
          puVar4[uVar8] = puVar4[uVar8] & ~uVar6;
          if (uVar8 + 1 < uVar9) {
            memset(puVar4 + (ulong)(uVar1 >> 6) + 1,0,(ulong)((uVar9 - uVar8) - 2) * 8 + 8);
          }
          uVar6 = 0xffffffffffffffff >> (~bVar11 & 0x3f);
        }
        puVar4[uVar9] = puVar4[uVar9] & ~uVar6;
      }
      lVar10 = lVar10 + 1;
    } while (iVar5 != lVar10);
  }
  iVar5 = bitset_container_compute_cardinality(src_1);
  src_1->cardinality = iVar5;
  if (iVar5 < 0x1001) {
    paVar7 = array_container_from_bitset(src_1);
    *dst = paVar7;
    bitset_container_free(src_1);
  }
  return 0x1000 < iVar5;
}

Assistant:

bool bitset_run_container_iandnot(bitset_container_t *src_1,
                                  const run_container_t *src_2,
                                  container_t **dst) {
    *dst = src_1;

    for (int32_t rlepos = 0; rlepos < src_2->n_runs; ++rlepos) {
        rle16_t rle = src_2->runs[rlepos];
        bitset_reset_range(src_1->words, rle.value,
                           rle.value + rle.length + UINT32_C(1));
    }
    src_1->cardinality = bitset_container_compute_cardinality(src_1);

    if (src_1->cardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(src_1);
        bitset_container_free(src_1);
        return false;  // not bitset
    } else
        return true;
}